

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O1

void lowbd_fwd_txfm2d_64x64_sse4_1(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  long lVar1;
  undefined4 *puVar2;
  byte bVar3;
  undefined2 uVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  int8_t *piVar12;
  int16_t *piVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  int32_t *piVar17;
  long lVar18;
  undefined1 *puVar19;
  undefined4 uVar20;
  __m128i round;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined4 uVar25;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined4 uVar38;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar46 [16];
  undefined4 uVar47;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  __m128i buf0 [64];
  __m128i bufB [64];
  __m128i bufA [64];
  __m128i buf1 [512];
  longlong local_2c38 [2];
  undefined2 auStack_2c28 [8];
  undefined1 auStack_2c18 [16];
  undefined2 auStack_2c08 [8];
  undefined1 auStack_2bf8 [16];
  undefined2 auStack_2be8 [8];
  undefined1 auStack_2bd8 [16];
  undefined2 auStack_2bc8 [456];
  undefined8 local_2838;
  int aiStack_2830 [254];
  undefined8 local_2438;
  int aiStack_2430 [254];
  undefined1 local_2038 [112];
  undefined1 local_1fc8 [8088];
  undefined1 auVar21 [12];
  undefined1 auVar23 [16];
  undefined1 auVar26 [12];
  undefined1 auVar27 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [12];
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar48 [12];
  undefined1 auVar49 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  
  piVar12 = av1_fwd_txfm_shift_ls[4];
  puVar19 = local_1fc8;
  lVar18 = 0;
  do {
    lVar15 = 0;
    piVar13 = input;
    do {
      uVar7 = *(undefined8 *)(piVar13 + 4);
      *(undefined8 *)((long)local_2c38 + lVar15) = *(undefined8 *)piVar13;
      *(undefined8 *)((long)auStack_2c28 + lVar15 + -8) = uVar7;
      lVar15 = lVar15 + 0x10;
      piVar13 = piVar13 + stride;
    } while (lVar15 != 0x400);
    bVar3 = *piVar12;
    if ((char)bVar3 < '\0') {
      auVar22 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
      auVar22 = pshuflw(auVar22,auVar22,0);
      auVar22._4_4_ = auVar22._0_4_;
      auVar22._8_4_ = auVar22._0_4_;
      auVar22._12_4_ = auVar22._0_4_;
      lVar15 = 0;
      do {
        auVar29 = paddsw(*(undefined1 (*) [16])((long)local_2c38 + lVar15),auVar22);
        auVar29 = psraw(auVar29,ZEXT416((uint)-(int)(char)bVar3));
        *(undefined1 (*) [16])((long)local_2c38 + lVar15) = auVar29;
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x400);
    }
    else if (bVar3 != 0) {
      lVar15 = 0;
      do {
        auVar22 = psllw(*(undefined1 (*) [16])((long)local_2c38 + lVar15),
                        ZEXT416((uint)(int)(char)bVar3));
        *(undefined1 (*) [16])((long)local_2c38 + lVar15) = auVar22;
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x400);
    }
    av1_fdct8x64_new_sse2(&local_2c38,&local_2c38,'\r');
    bVar3 = piVar12[1];
    uVar14 = (uint)(char)bVar3;
    if ((int)uVar14 < 0) {
      auVar22 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
      auVar22 = pshuflw(auVar22,auVar22,0);
      auVar29._0_4_ = auVar22._0_4_;
      auVar29._4_4_ = auVar29._0_4_;
      auVar29._8_4_ = auVar29._0_4_;
      auVar29._12_4_ = auVar29._0_4_;
      lVar15 = 0;
      do {
        auVar22 = paddsw(*(undefined1 (*) [16])((long)local_2c38 + lVar15),auVar29);
        auVar22 = psraw(auVar22,ZEXT416(-uVar14));
        *(undefined1 (*) [16])((long)local_2c38 + lVar15) = auVar22;
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x400);
    }
    else if (bVar3 != 0) {
      lVar15 = 0;
      do {
        auVar22 = psllw(*(undefined1 (*) [16])((long)local_2c38 + lVar15),ZEXT416(uVar14));
        *(undefined1 (*) [16])((long)local_2c38 + lVar15) = auVar22;
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x400);
    }
    lVar15 = 0;
    do {
      auVar22 = *(undefined1 (*) [16])((long)local_2c38 + lVar15);
      auVar29 = *(undefined1 (*) [16])((long)auStack_2c28 + lVar15 + 0x10);
      auVar33._0_12_ = auVar22._0_12_;
      auVar33._12_2_ = auVar22._6_2_;
      auVar33._14_2_ = *(undefined2 *)((long)auStack_2c28 + lVar15 + 6);
      auVar32._12_4_ = auVar33._12_4_;
      auVar32._0_10_ = auVar22._0_10_;
      auVar32._10_2_ = *(undefined2 *)((long)auStack_2c28 + lVar15 + 4);
      auVar31._10_6_ = auVar32._10_6_;
      auVar31._0_8_ = auVar22._0_8_;
      auVar31._8_2_ = auVar22._4_2_;
      auVar8._4_8_ = auVar31._8_8_;
      auVar8._2_2_ = *(undefined2 *)((long)auStack_2c28 + lVar15 + 2);
      auVar8._0_2_ = auVar22._2_2_;
      auVar30._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_2c28 + lVar15),auVar22._0_2_);
      auVar30._4_12_ = auVar8;
      auVar45._0_12_ = auVar29._0_12_;
      auVar45._12_2_ = auVar29._6_2_;
      auVar45._14_2_ = *(undefined2 *)((long)auStack_2c08 + lVar15 + 6);
      auVar44._12_4_ = auVar45._12_4_;
      auVar44._0_10_ = auVar29._0_10_;
      auVar44._10_2_ = *(undefined2 *)((long)auStack_2c08 + lVar15 + 4);
      auVar43._10_6_ = auVar44._10_6_;
      auVar43._0_8_ = auVar29._0_8_;
      auVar43._8_2_ = auVar29._4_2_;
      auVar9._4_8_ = auVar43._8_8_;
      auVar9._2_2_ = *(undefined2 *)((long)auStack_2c08 + lVar15 + 2);
      auVar9._0_2_ = auVar29._2_2_;
      auVar27 = *(undefined1 (*) [16])((long)auStack_2c08 + lVar15 + 0x10);
      auVar37._0_12_ = auVar27._0_12_;
      auVar37._12_2_ = auVar27._6_2_;
      auVar37._14_2_ = *(undefined2 *)((long)auStack_2be8 + lVar15 + 6);
      auVar36._12_4_ = auVar37._12_4_;
      auVar36._0_10_ = auVar27._0_10_;
      auVar36._10_2_ = *(undefined2 *)((long)auStack_2be8 + lVar15 + 4);
      auVar35._10_6_ = auVar36._10_6_;
      auVar35._0_8_ = auVar27._0_8_;
      auVar35._8_2_ = auVar27._4_2_;
      auVar10._4_8_ = auVar35._8_8_;
      auVar10._2_2_ = *(undefined2 *)((long)auStack_2be8 + lVar15 + 2);
      auVar10._0_2_ = auVar27._2_2_;
      auVar34._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_2be8 + lVar15),auVar27._0_2_);
      auVar34._4_12_ = auVar10;
      auVar33 = *(undefined1 (*) [16])((long)auStack_2be8 + lVar15 + 0x10);
      uVar4 = *(undefined2 *)((long)auStack_2bc8 + lVar15);
      auVar53._0_12_ = auVar33._0_12_;
      auVar53._12_2_ = auVar33._6_2_;
      auVar53._14_2_ = *(undefined2 *)((long)auStack_2bc8 + lVar15 + 6);
      auVar52._12_4_ = auVar53._12_4_;
      auVar52._0_10_ = auVar33._0_10_;
      auVar52._10_2_ = *(undefined2 *)((long)auStack_2bc8 + lVar15 + 4);
      auVar51._10_6_ = auVar52._10_6_;
      auVar51._0_8_ = auVar33._0_8_;
      auVar51._8_2_ = auVar33._4_2_;
      auVar11._4_8_ = auVar51._8_8_;
      auVar11._2_2_ = *(undefined2 *)((long)auStack_2bc8 + lVar15 + 2);
      auVar11._0_2_ = auVar33._2_2_;
      uVar20 = CONCAT22(*(undefined2 *)((long)auStack_2c28 + lVar15 + 8),auVar22._8_2_);
      auVar21._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_2c28 + lVar15 + 10),
                    CONCAT24(auVar22._10_2_,uVar20));
      auVar21._8_2_ = auVar22._12_2_;
      auVar21._10_2_ = *(undefined2 *)((long)auStack_2c28 + lVar15 + 0xc);
      auVar23._12_2_ = auVar22._14_2_;
      auVar23._0_12_ = auVar21;
      auVar23._14_2_ = *(undefined2 *)((long)auStack_2c28 + lVar15 + 0xe);
      uVar38 = CONCAT22(*(undefined2 *)((long)auStack_2c08 + lVar15 + 8),auVar29._8_2_);
      auVar39._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_2c08 + lVar15 + 10),
                    CONCAT24(auVar29._10_2_,uVar38));
      auVar39._8_2_ = auVar29._12_2_;
      auVar39._10_2_ = *(undefined2 *)((long)auStack_2c08 + lVar15 + 0xc);
      auVar40._12_2_ = auVar29._14_2_;
      auVar40._0_12_ = auVar39;
      auVar40._14_2_ = *(undefined2 *)((long)auStack_2c08 + lVar15 + 0xe);
      uVar25 = CONCAT22(*(undefined2 *)((long)auStack_2be8 + lVar15 + 8),auVar27._8_2_);
      auVar26._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_2be8 + lVar15 + 10),
                    CONCAT24(auVar27._10_2_,uVar25));
      auVar26._8_2_ = auVar27._12_2_;
      auVar26._10_2_ = *(undefined2 *)((long)auStack_2be8 + lVar15 + 0xc);
      auVar27._12_2_ = auVar27._14_2_;
      auVar27._0_12_ = auVar26;
      auVar27._14_2_ = *(undefined2 *)((long)auStack_2be8 + lVar15 + 0xe);
      uVar47 = CONCAT22(*(undefined2 *)((long)auStack_2bc8 + lVar15 + 8),auVar33._8_2_);
      auVar48._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_2bc8 + lVar15 + 10),
                    CONCAT24(auVar33._10_2_,uVar47));
      auVar48._8_2_ = auVar33._12_2_;
      auVar48._10_2_ = *(undefined2 *)((long)auStack_2bc8 + lVar15 + 0xc);
      auVar49._12_2_ = auVar33._14_2_;
      auVar49._0_12_ = auVar48;
      auVar49._14_2_ = *(undefined2 *)((long)auStack_2bc8 + lVar15 + 0xe);
      auVar41._0_8_ = auVar30._0_8_;
      auVar41._8_4_ = auVar8._0_4_;
      auVar41._12_4_ = auVar9._0_4_;
      auVar42._0_8_ = auVar34._0_8_;
      auVar42._8_4_ = auVar10._0_4_;
      auVar42._12_4_ = auVar11._0_4_;
      auVar46._8_4_ = (int)((ulong)auVar21._0_8_ >> 0x20);
      auVar46._0_8_ = auVar21._0_8_;
      auVar46._12_4_ = (int)((ulong)auVar39._0_8_ >> 0x20);
      auVar50._8_4_ = (int)((ulong)auVar26._0_8_ >> 0x20);
      auVar50._0_8_ = auVar26._0_8_;
      auVar50._12_4_ = (int)((ulong)auVar48._0_8_ >> 0x20);
      auVar28._0_8_ = CONCAT44(auVar48._8_4_,auVar26._8_4_);
      auVar28._8_4_ = auVar27._12_4_;
      auVar28._12_4_ = auVar49._12_4_;
      *(ulong *)(puVar19 + lVar15 * 8 + -0x70) =
           CONCAT44(CONCAT22(*(undefined2 *)((long)auStack_2c08 + lVar15),auVar29._0_2_),
                    auVar30._0_4_);
      *(ulong *)((long)(puVar19 + lVar15 * 8 + -0x70) + 8) =
           CONCAT44(CONCAT22(uVar4,auVar33._0_2_),auVar34._0_4_);
      *(long *)(puVar19 + lVar15 * 8 + -0x60) = auVar41._8_8_;
      *(long *)((long)(puVar19 + lVar15 * 8 + -0x60) + 8) = auVar42._8_8_;
      puVar2 = (undefined4 *)(puVar19 + lVar15 * 8 + -0x50);
      *puVar2 = auVar31._8_4_;
      puVar2[1] = auVar43._8_4_;
      puVar2[2] = auVar35._8_4_;
      puVar2[3] = auVar51._8_4_;
      lVar1 = lVar15 * 8;
      *(undefined4 *)(puVar19 + lVar1 + -0x38) = auVar32._12_4_;
      *(undefined4 *)(puVar19 + lVar1 + -0x34) = auVar44._12_4_;
      *(undefined4 *)(puVar19 + lVar1 + -0x30) = auVar36._12_4_;
      *(undefined4 *)(puVar19 + lVar1 + -0x2c) = auVar52._12_4_;
      *(ulong *)(puVar19 + lVar15 * 8 + -0x30) = CONCAT44(uVar38,uVar20);
      *(ulong *)((long)(puVar19 + lVar15 * 8 + -0x30) + 8) = CONCAT44(uVar47,uVar25);
      *(long *)(puVar19 + lVar15 * 8 + -0x20) = auVar46._8_8_;
      *(long *)((long)(puVar19 + lVar15 * 8 + -0x20) + 8) = auVar50._8_8_;
      puVar2 = (undefined4 *)(puVar19 + lVar15 * 8 + -0x10);
      *puVar2 = auVar21._8_4_;
      puVar2[1] = auVar39._8_4_;
      *(undefined8 *)(puVar2 + 2) = auVar28._0_8_;
      *(int *)(puVar19 + lVar15 * 8 + 8) = auVar23._12_4_;
      *(int *)(puVar19 + lVar15 * 8 + 0xc) = auVar40._12_4_;
      *(long *)(puVar19 + lVar15 * 8 + 8) = auVar28._8_8_;
      lVar15 = lVar15 + 0x80;
    } while (lVar15 != 0x200);
    lVar18 = lVar18 + 1;
    input = input + 8;
    puVar19 = puVar19 + 0x80;
  } while (lVar18 != 8);
  piVar17 = output + 4;
  puVar19 = local_2038;
  lVar18 = 0;
  do {
    lVar15 = 0;
    do {
      auVar22 = *(undefined1 (*) [16])(puVar19 + lVar15);
      auVar28 = pmovsxwd(auVar28,auVar22);
      *(undefined1 (*) [16])((long)&local_2438 + lVar15) = auVar28;
      auVar24._8_4_ = auVar22._8_4_;
      auVar24._12_4_ = auVar22._12_4_;
      auVar24._0_8_ = auVar22._8_8_;
      auVar22 = pmovsxwd(auVar24,auVar24);
      *(undefined1 (*) [16])((long)&local_2838 + lVar15) = auVar22;
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0x400);
    av1_fdct64_sse4_1((__m128i *)&local_2438,(__m128i *)&local_2438,'\n',1,1);
    av1_fdct64_sse4_1((__m128i *)&local_2838,(__m128i *)&local_2838,'\n',1,1);
    bVar3 = piVar12[2];
    if ((char)bVar3 < '\0') {
      iVar16 = 1 << (~bVar3 & 0x1f);
      auVar22 = ZEXT416((uint)-(int)(char)bVar3);
      lVar15 = 0;
      do {
        iVar5 = *(int *)((long)aiStack_2430 + lVar15);
        iVar6 = *(int *)((long)aiStack_2430 + lVar15 + 4);
        *(int *)((long)&local_2438 + lVar15) =
             *(int *)((long)&local_2438 + lVar15) + iVar16 >> auVar22;
        *(int *)((long)&local_2438 + lVar15 + 4) =
             *(int *)((long)&local_2438 + lVar15 + 4) + iVar16 >> auVar22;
        *(int *)((long)aiStack_2430 + lVar15) = iVar5 + iVar16 >> auVar22;
        *(int *)((long)aiStack_2430 + lVar15 + 4) = iVar6 + iVar16 >> auVar22;
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x200);
    }
    else {
      lVar15 = 0;
      do {
        uVar20 = *(undefined4 *)((long)aiStack_2430 + lVar15);
        uVar25 = *(undefined4 *)((long)aiStack_2430 + lVar15 + 4);
        *(int *)((long)&local_2438 + lVar15) =
             *(int *)((long)&local_2438 + lVar15) << (int)(char)bVar3;
        *(undefined4 *)((long)&local_2438 + lVar15 + 4) =
             *(undefined4 *)((long)&local_2438 + lVar15 + 4);
        *(undefined4 *)((long)aiStack_2430 + lVar15) = uVar20;
        *(undefined4 *)((long)aiStack_2430 + lVar15 + 4) = uVar25;
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x200);
    }
    bVar3 = piVar12[2];
    if ((char)bVar3 < '\0') {
      iVar16 = 1 << (~bVar3 & 0x1f);
      auVar28 = ZEXT416((uint)-(int)(char)bVar3);
      lVar15 = 0;
      do {
        iVar5 = *(int *)((long)aiStack_2830 + lVar15);
        iVar6 = *(int *)((long)aiStack_2830 + lVar15 + 4);
        *(int *)((long)&local_2838 + lVar15) =
             *(int *)((long)&local_2838 + lVar15) + iVar16 >> auVar28;
        *(int *)((long)&local_2838 + lVar15 + 4) =
             *(int *)((long)&local_2838 + lVar15 + 4) + iVar16 >> auVar28;
        *(int *)((long)aiStack_2830 + lVar15) = iVar5 + iVar16 >> auVar28;
        *(int *)((long)aiStack_2830 + lVar15 + 4) = iVar6 + iVar16 >> auVar28;
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x200);
    }
    else {
      lVar15 = 0;
      do {
        auVar28._0_4_ = *(int *)((long)&local_2838 + lVar15) << (int)(char)bVar3;
        auVar28._4_4_ = *(undefined4 *)((long)&local_2838 + lVar15 + 4);
        auVar28._8_4_ = *(undefined4 *)((long)aiStack_2830 + lVar15);
        auVar28._12_4_ = *(undefined4 *)((long)aiStack_2830 + lVar15 + 4);
        *(undefined1 (*) [16])((long)&local_2838 + lVar15) = auVar28;
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x200);
    }
    lVar15 = 0;
    do {
      uVar7 = *(undefined8 *)((long)aiStack_2430 + lVar15);
      *(undefined8 *)(piVar17 + lVar15 * 2 + -4) = *(undefined8 *)((long)&local_2438 + lVar15);
      *(undefined8 *)(piVar17 + lVar15 * 2 + -4 + 2) = uVar7;
      uVar7 = *(undefined8 *)((long)aiStack_2830 + lVar15);
      *(undefined8 *)(piVar17 + lVar15 * 2) = *(undefined8 *)((long)&local_2838 + lVar15);
      *(undefined8 *)(piVar17 + lVar15 * 2 + 2) = uVar7;
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0x200);
    lVar18 = lVar18 + 1;
    puVar19 = puVar19 + 0x400;
    piVar17 = piVar17 + 8;
  } while (lVar18 != 4);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_64x64_sse4_1(const int16_t *input, int32_t *output,
                                          int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_64X64;
  __m128i buf0[64], buf1[512];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_sse2 col_txfm = av1_fdct8x64_new_sse2;
  const int width_div8 = (width >> 3);
  const int height_div8 = (height >> 3);

  for (int i = 0; i < width_div8; i++) {
    load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    for (int j = 0; j < AOMMIN(4, height_div8); ++j) {
      transpose_16bit_8x8(buf0 + j * 8, buf1 + j * width + 8 * i);
    }
  }
  for (int i = 0; i < AOMMIN(4, height_div8); i++) {
    __m128i bufA[64];
    __m128i bufB[64];
    __m128i *buf = buf1 + width * i;
    for (int j = 0; j < width; ++j) {
      bufA[j] = _mm_cvtepi16_epi32(buf[j]);
      bufB[j] = _mm_cvtepi16_epi32(_mm_unpackhi_epi64(buf[j], buf[j]));
    }
    av1_fdct64_sse4_1(bufA, bufA, cos_bit_row, 1, 1);
    av1_fdct64_sse4_1(bufB, bufB, cos_bit_row, 1, 1);
    av1_round_shift_array_32_sse4_1(bufA, bufA, 32, -shift[2]);
    av1_round_shift_array_32_sse4_1(bufB, bufB, 32, -shift[2]);

    store_output_32bit_w8(output + i * 8, bufA, bufB, 32, 32);
  }
}